

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O0

ostream * std::operator<<(ostream *os,uint4 *v)

{
  ostream *poVar1;
  const_reference pvVar2;
  uint4 *v_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"(");
  pvVar2 = array<unsigned_int,_4UL>::operator[](v,0);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1,", ");
  pvVar2 = array<unsigned_int,_4UL>::operator[](v,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1,", ");
  pvVar2 = array<unsigned_int,_4UL>::operator[](v,2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1,", ");
  pvVar2 = array<unsigned_int,_4UL>::operator[](v,3);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  std::operator<<(poVar1,")");
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const tinyusdz::value::uint4 &v) {
  os << "(" << v[0] << ", " << v[1] << ", " << v[2] << ", " << v[3] << ")";
  return os;
}